

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O2

int SetPulsePololu(POLOLU *pPololu,int channel,int duration)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = SetPWMPololu(pPololu,channel,2000);
  if (iVar1 == 0) {
    mSleep((long)(duration / 1000));
    iVar1 = SetPWMPololu(pPololu,channel,1000);
    uVar2 = (uint)(iVar1 != 0);
  }
  else {
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

inline int SetPulsePololu(POLOLU* pPololu, int channel, int duration)
{
	if (SetPWMPololu(pPololu, channel, 2000) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	mSleep(duration/1000);
	if (SetPWMPololu(pPololu, channel, 1000) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}